

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  int iVar1;
  Mat *this_00;
  size_t sVar2;
  int iVar3;
  uint _w;
  uint _w_00;
  long lVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  long local_268;
  void *local_260;
  long *local_250;
  int local_234;
  long local_230;
  long local_228;
  long local_210;
  pointer local_208;
  int *local_1f0;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  long local_b0;
  long local_a8;
  Mat *local_a0;
  long local_98;
  pointer local_90;
  pointer local_88;
  long local_80;
  Mat local_78;
  
  if (this->int8_scale_term != 0) {
    iVar3 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar3;
  }
  local_88 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)local_88;
  local_90 = local_88;
  local_208 = local_88;
  if (lVar4 == 0x48) {
    iVar3 = this->attn_mask;
LAB_00516a7b:
    if (iVar3 == 0) {
      local_260 = (void *)0x0;
      piVar18 = (int *)0x0;
      lVar16 = 0;
      local_250 = (long *)0x0;
      local_234 = 0;
      iVar3 = 0;
      local_228 = 0;
      goto LAB_00516b16;
    }
  }
  else {
    iVar3 = this->attn_mask;
    if (iVar3 == 0 || lVar4 != 0x90) {
      local_90 = local_88 + 1;
      local_208 = local_90;
      if (iVar3 == 0) {
        local_208 = local_88 + 2;
      }
      if (lVar4 != 0xd8) {
        local_208 = local_88 + 2;
      }
      if (lVar4 == 0x90) {
        local_208 = local_90;
      }
      goto LAB_00516a7b;
    }
  }
  local_260 = *(void **)((long)local_88 + lVar4 + -0x48);
  piVar18 = *(int **)((long)local_88 + lVar4 + -0x40);
  lVar16 = *(long *)((long)local_88 + lVar4 + -0x38);
  local_250 = *(long **)((long)local_88 + lVar4 + -0x28);
  local_234 = *(int *)((long)local_88 + lVar4 + -0x20);
  iVar3 = *(int *)((long)local_88 + lVar4 + -0x1c);
  local_228 = *(long *)((long)local_88 + lVar4 + -8);
  if (piVar18 == (int *)0x0) {
    piVar18 = (int *)0x0;
  }
  else {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
  }
LAB_00516b16:
  local_1f0 = &this->attn_mask;
  _h = local_88->h;
  uVar9 = (ulong)_h;
  _h_00 = local_90->h;
  uVar13 = (ulong)_h_00;
  _w = this->embed_dim / this->num_heads;
  _w_00 = this->weight_data_size / this->embed_dim;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w_00,_h,4,opt->blob_allocator);
  iVar6 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    local_a0 = this_00;
    Mat::create(&local_f8,_w,_h,this->num_heads,4,opt->workspace_allocator);
    iVar6 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      local_148.cstep = 0;
      local_148.data = (void *)0x0;
      local_148.refcount._0_4_ = 0;
      local_148.refcount._4_4_ = 0;
      local_148.elemsize._0_4_ = 0;
      local_148.elemsize._4_4_ = 0;
      local_148.elempack = 0;
      local_148.allocator = (Allocator *)0x0;
      local_148.dims = 0;
      local_148.w = 0;
      local_148.h = 0;
      local_148.d = 0;
      local_148.c = 0;
      Mat::create(&local_148,_w,_h_00,this->num_heads,4,opt->workspace_allocator);
      iVar6 = -100;
      if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
        Mat::create(&local_198,_h_00,_w,this->num_heads,4,opt->workspace_allocator);
        iVar6 = -100;
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
          Mat::create(&local_1e8,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
          iVar6 = -100;
          if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
            local_78.cstep = 0;
            local_78.data = (void *)0x0;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.elemsize._0_4_ = 0;
            local_78.elemsize._4_4_ = 0;
            local_78.elempack = 0;
            local_78.allocator = (Allocator *)0x0;
            local_78.dims = 0;
            local_78.w = 0;
            local_78.h = 0;
            local_78.d = 0;
            local_78.c = 0;
            Mat::create(&local_78,_w,this->num_heads,_h,4,opt->workspace_allocator);
            iVar6 = -100;
            if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
              if (0 < this->num_heads) {
                lVar4 = (long)(int)_w;
                uVar15 = (ulong)_w;
                local_a8 = lVar4 * (int)_w_00 * 4;
                local_80 = (long)(int)_w_00 << 2;
                local_b0 = lVar4 * 4;
                local_230 = 0;
                local_210 = 0;
                local_268 = 0;
                do {
                  if (0 < (int)_h) {
                    pvVar8 = (this->q_bias_data).data;
                    pvVar10 = (this->q_weight_data).data;
                    uVar7 = 0;
                    do {
                      if (0 < (int)_w) {
                        iVar6 = local_88->w;
                        sVar2 = local_88->elemsize;
                        pvVar12 = local_88->data;
                        uVar17 = 0;
                        lVar11 = (long)pvVar10 + local_210;
                        do {
                          fVar22 = *(float *)((long)pvVar8 + (uVar17 + local_268 * lVar4) * 4);
                          if (0 < (int)_w_00) {
                            lVar19 = 0;
                            do {
                              fVar22 = fVar22 + *(float *)(lVar11 + lVar19 * 4) *
                                                *(float *)((long)pvVar12 +
                                                          lVar19 * 4 + sVar2 * uVar7 * (long)iVar6);
                              lVar19 = lVar19 + 1;
                            } while (_w_00 != (uint)lVar19);
                          }
                          *(float *)((long)local_f8.data +
                                    uVar17 * 4 +
                                    (long)local_f8.w *
                                    CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize)
                                    * uVar7 + local_f8.cstep * local_268 *
                                              CONCAT44(local_f8.elemsize._4_4_,
                                                       (undefined4)local_f8.elemsize)) =
                               fVar22 * this->scale;
                          uVar17 = uVar17 + 1;
                          lVar11 = lVar11 + local_80;
                        } while (uVar17 != uVar15);
                      }
                      uVar7 = uVar7 + 1;
                    } while (uVar7 != uVar9);
                  }
                  if (0 < (int)_h_00) {
                    iVar6 = this->kdim;
                    pvVar8 = (this->k_bias_data).data;
                    pvVar10 = (this->k_weight_data).data;
                    uVar7 = 0;
                    do {
                      if (0 < (int)_w) {
                        iVar1 = local_90->w;
                        sVar2 = local_90->elemsize;
                        pvVar12 = local_90->data;
                        uVar17 = 0;
                        pvVar14 = (void *)(local_230 * iVar6 + (long)pvVar10);
                        do {
                          fVar22 = *(float *)((long)pvVar8 + (uVar17 + local_268 * lVar4) * 4);
                          if (0 < iVar6) {
                            lVar11 = 0;
                            do {
                              fVar22 = fVar22 + *(float *)((long)pvVar14 + lVar11 * 4) *
                                                *(float *)((long)pvVar12 +
                                                          lVar11 * 4 + sVar2 * uVar7 * (long)iVar1);
                              lVar11 = lVar11 + 1;
                            } while (iVar6 != (int)lVar11);
                          }
                          *(float *)((long)local_148.data +
                                    uVar17 * 4 +
                                    (long)local_148.w *
                                    CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize
                                            ) * uVar7 +
                                    local_148.cstep * local_268 *
                                    CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize
                                            )) = fVar22;
                          uVar17 = uVar17 + 1;
                          pvVar14 = (void *)((long)pvVar14 + (long)iVar6 * 4);
                        } while (uVar17 != uVar15);
                      }
                      uVar7 = uVar7 + 1;
                    } while (uVar7 != uVar13);
                  }
                  if (0 < (int)_w) {
                    iVar6 = this->vdim;
                    pvVar8 = (this->v_bias_data).data;
                    pvVar10 = (void *)(local_230 * iVar6 + (long)(this->v_weight_data).data);
                    uVar7 = 0;
                    do {
                      if (0 < (int)_h_00) {
                        pvVar12 = local_208->data;
                        iVar1 = local_208->w;
                        sVar2 = local_208->elemsize;
                        uVar17 = 0;
                        do {
                          fVar22 = *(float *)((long)pvVar8 + (uVar7 + local_268 * lVar4) * 4);
                          if (0 < iVar6) {
                            lVar11 = 0;
                            do {
                              fVar22 = fVar22 + *(float *)((long)pvVar10 + lVar11 * 4) *
                                                *(float *)((long)pvVar12 + lVar11 * 4);
                              lVar11 = lVar11 + 1;
                            } while (iVar6 != (int)lVar11);
                          }
                          *(float *)((long)local_198.data +
                                    uVar17 * 4 +
                                    (long)local_198.w *
                                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize
                                            ) * uVar7 +
                                    local_198.cstep * local_268 *
                                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize
                                            )) = fVar22;
                          uVar17 = uVar17 + 1;
                          pvVar12 = (void *)((long)pvVar12 + (long)iVar1 * sVar2);
                        } while (uVar17 != uVar13);
                      }
                      uVar7 = uVar7 + 1;
                      pvVar10 = (void *)((long)pvVar10 + (long)iVar6 * 4);
                    } while (uVar7 != uVar15);
                  }
                  if (0 < (int)_h) {
                    pvVar8 = (void *)(local_f8.cstep *
                                      CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize
                                              ) * local_268 + (long)local_f8.data);
                    uVar7 = 0;
                    do {
                      if (0 < (int)_h_00) {
                        uVar17 = 0;
                        pvVar10 = (void *)(CONCAT44(local_148.elemsize._4_4_,
                                                    (undefined4)local_148.elemsize) *
                                           local_148.cstep * local_268 + (long)local_148.data);
                        do {
                          fVar22 = 0.0;
                          if (0 < (int)_w) {
                            lVar11 = 0;
                            do {
                              fVar22 = fVar22 + *(float *)((long)pvVar10 + lVar11 * 4) *
                                                *(float *)((long)pvVar8 + lVar11 * 4);
                              lVar11 = lVar11 + 1;
                            } while (_w != (uint)lVar11);
                          }
                          *(float *)((long)local_1e8.data +
                                    uVar17 * 4 +
                                    (long)local_1e8.w *
                                    CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize
                                            ) * uVar7 +
                                    local_1e8.cstep * local_268 *
                                    CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize
                                            )) = fVar22;
                          uVar17 = uVar17 + 1;
                          pvVar10 = (void *)((long)pvVar10 +
                                            (long)local_148.w *
                                            CONCAT44(local_148.elemsize._4_4_,
                                                     (undefined4)local_148.elemsize));
                        } while (uVar17 != uVar13);
                      }
                      uVar7 = uVar7 + 1;
                      pvVar8 = (void *)((long)pvVar8 +
                                       (long)local_f8.w *
                                       CONCAT44(local_f8.elemsize._4_4_,
                                                (undefined4)local_f8.elemsize));
                    } while (uVar7 != uVar9);
                  }
                  if (*local_1f0 != 0) {
                    if (local_234 == 3) {
                      piVar5 = (int *)0x0;
                      pvVar8 = (void *)(local_228 * lVar16 * local_268 + (long)local_260);
                    }
                    else {
                      pvVar8 = local_260;
                      if (piVar18 == (int *)0x0) {
                        piVar5 = (int *)0x0;
                      }
                      else {
                        LOCK();
                        *piVar18 = *piVar18 + 1;
                        UNLOCK();
                        piVar5 = piVar18;
                      }
                    }
                    if (0 < (int)_h) {
                      pvVar12 = (void *)(CONCAT44(local_1e8.elemsize._4_4_,
                                                  (undefined4)local_1e8.elemsize) * local_1e8.cstep
                                         * local_268 + (long)local_1e8.data);
                      uVar7 = 0;
                      pvVar10 = pvVar8;
                      do {
                        if (0 < (int)_h_00) {
                          uVar17 = 0;
                          do {
                            *(float *)((long)pvVar12 + uVar17 * 4) =
                                 *(float *)((long)pvVar12 + uVar17 * 4) +
                                 *(float *)((long)pvVar10 + uVar17 * 4);
                            uVar17 = uVar17 + 1;
                          } while (uVar13 != uVar17);
                        }
                        uVar7 = uVar7 + 1;
                        pvVar12 = (void *)((long)pvVar12 +
                                          (long)local_1e8.w *
                                          CONCAT44(local_1e8.elemsize._4_4_,
                                                   (undefined4)local_1e8.elemsize));
                        pvVar10 = (void *)((long)pvVar10 + iVar3 * lVar16);
                      } while (uVar7 != uVar9);
                    }
                    if (piVar5 != (int *)0x0) {
                      LOCK();
                      *piVar5 = *piVar5 + -1;
                      UNLOCK();
                      if (*piVar5 == 0) {
                        if (local_250 == (long *)0x0) {
                          if (pvVar8 != (void *)0x0) {
                            free(pvVar8);
                          }
                        }
                        else {
                          (**(code **)(*local_250 + 0x18))();
                        }
                      }
                    }
                  }
                  lVar11 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                  if ((int)_h < 1) {
                    lVar19 = local_1e8.cstep * local_268 * lVar11;
                  }
                  else {
                    lVar19 = local_1e8.w * lVar11;
                    pvVar8 = (void *)((long)local_1e8.data + local_1e8.cstep * lVar11 * local_268);
                    uVar7 = 0;
                    local_98 = lVar19;
                    do {
                      if (0 < (int)_h_00) {
                        uVar17 = 0;
                        fVar22 = -3.4028235e+38;
                        do {
                          fVar24 = *(float *)((long)pvVar8 + uVar17 * 4);
                          if (fVar22 <= fVar24) {
                            fVar22 = fVar24;
                          }
                          uVar17 = uVar17 + 1;
                        } while (uVar13 != uVar17);
                        if (0 < (int)_h_00) {
                          fVar24 = 0.0;
                          uVar17 = 0;
                          do {
                            fVar23 = expf(*(float *)((long)pvVar8 + uVar17 * 4) - fVar22);
                            *(float *)((long)pvVar8 + uVar17 * 4) = fVar23;
                            fVar24 = fVar24 + fVar23;
                            uVar17 = uVar17 + 1;
                          } while (uVar13 != uVar17);
                          lVar19 = local_98;
                          if (0 < (int)_h_00) {
                            uVar17 = 0;
                            do {
                              *(float *)((long)pvVar8 + uVar17 * 4) =
                                   *(float *)((long)pvVar8 + uVar17 * 4) * (1.0 / fVar24);
                              uVar17 = uVar17 + 1;
                            } while (uVar13 != uVar17);
                          }
                        }
                      }
                      uVar7 = uVar7 + 1;
                      pvVar8 = (void *)((long)pvVar8 + lVar19);
                    } while (uVar7 != uVar9);
                    lVar11 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                    lVar19 = local_1e8.cstep * local_268 * lVar11;
                  }
                  if (0 < (int)_h) {
                    lVar19 = (long)local_1e8.data + lVar19;
                    uVar7 = 0;
                    do {
                      if (0 < (int)_w) {
                        uVar17 = 0;
                        pvVar8 = (void *)(CONCAT44(local_198.elemsize._4_4_,
                                                   (undefined4)local_198.elemsize) * local_198.cstep
                                          * local_268 + (long)local_198.data);
                        do {
                          fVar22 = 0.0;
                          if (0 < (int)_h_00) {
                            lVar20 = 0;
                            do {
                              fVar22 = fVar22 + *(float *)((long)pvVar8 + lVar20 * 4) *
                                                *(float *)(lVar19 + lVar20 * 4);
                              lVar20 = lVar20 + 1;
                            } while (_h_00 != (uint)lVar20);
                          }
                          *(float *)((long)local_78.data +
                                    uVar17 * 4 +
                                    local_78.cstep *
                                    CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)
                                    * uVar7 + local_78.w * local_268 *
                                              CONCAT44(local_78.elemsize._4_4_,
                                                       (undefined4)local_78.elemsize)) = fVar22;
                          uVar17 = uVar17 + 1;
                          pvVar8 = (void *)((long)pvVar8 +
                                           (long)local_198.w *
                                           CONCAT44(local_198.elemsize._4_4_,
                                                    (undefined4)local_198.elemsize));
                        } while (uVar17 != uVar15);
                      }
                      uVar7 = uVar7 + 1;
                      lVar19 = lVar19 + lVar11 * local_1e8.w;
                    } while (uVar7 != uVar9);
                  }
                  local_268 = local_268 + 1;
                  local_210 = local_210 + local_a8;
                  local_230 = local_230 + local_b0;
                } while (local_268 < this->num_heads);
              }
              if (0 < (int)_h) {
                pvVar8 = local_a0->data;
                iVar3 = local_a0->w;
                sVar2 = local_a0->elemsize;
                pvVar10 = (this->out_weight_data).data;
                iVar6 = this->embed_dim;
                pvVar12 = (this->out_bias_data).data;
                uVar13 = 0;
                pvVar14 = local_78.data;
                do {
                  if (0 < (int)_w_00) {
                    uVar15 = 0;
                    pvVar21 = pvVar10;
                    do {
                      fVar22 = *(float *)((long)pvVar12 + uVar15 * 4);
                      if (0 < iVar6) {
                        lVar4 = 0;
                        do {
                          fVar22 = fVar22 + *(float *)((long)pvVar21 + lVar4 * 4) *
                                            *(float *)((long)pvVar14 + lVar4 * 4);
                          lVar4 = lVar4 + 1;
                        } while (iVar6 != (int)lVar4);
                      }
                      *(float *)((long)pvVar8 + uVar15 * 4 + (long)iVar3 * sVar2 * uVar13) = fVar22;
                      uVar15 = uVar15 + 1;
                      pvVar21 = (void *)((long)pvVar21 + (long)iVar6 * 4);
                    } while (uVar15 != _w_00);
                  }
                  uVar13 = uVar13 + 1;
                  pvVar14 = (void *)((long)pvVar14 +
                                    local_78.cstep *
                                    CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize))
                  ;
                } while (uVar13 != uVar9);
              }
              iVar6 = 0;
            }
            piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_78.allocator == (Allocator *)0x0) {
                  if (local_78.data != (void *)0x0) {
                    free(local_78.data);
                  }
                }
                else {
                  (*(local_78.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_1e8.allocator == (Allocator *)0x0) {
                if (local_1e8.data != (void *)0x0) {
                  free(local_1e8.data);
                }
              }
              else {
                (*(local_1e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_198.allocator == (Allocator *)0x0) {
              if (local_198.data != (void *)0x0) {
                free(local_198.data);
              }
            }
            else {
              (*(local_198.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if (local_148.data != (void *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_250 == (long *)0x0) {
        if (local_260 != (void *)0x0) {
          free(local_260);
        }
      }
      else {
        (**(code **)(*local_250 + 0x18))(local_250,local_260);
      }
    }
  }
  return iVar6;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * scale;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}